

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O0

bool MemoryProfiler::IsTraceEnabled(bool isRecycler)

{
  bool bVar1;
  Phase PVar2;
  bool local_b;
  bool local_9;
  bool isRecycler_local;
  
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)Js::Configuration::Global,TraceMemoryFlag);
  if (bVar1) {
    bVar1 = Js::Phases::IsEnabled((Phases *)(Js::Configuration::Global + 0x262f8),AllPhase);
    if (bVar1) {
      local_9 = true;
    }
    else if (isRecycler) {
      local_9 = Js::Phases::IsEnabled((Phases *)(Js::Configuration::Global + 0x262f8),RecyclerPhase)
      ;
    }
    else {
      bVar1 = Js::Phases::IsEnabled((Phases *)(Js::Configuration::Global + 0x262f8),RunPhase);
      local_b = true;
      if (!bVar1) {
        PVar2 = Js::Phases::GetFirstPhase((Phases *)(Js::Configuration::Global + 0x262f8));
        local_b = PVar2 == InvalidPhase;
      }
      local_9 = local_b;
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool
MemoryProfiler::IsTraceEnabled(bool isRecycler)
{
    if (!Js::Configuration::Global.flags.IsEnabled(Js::TraceMemoryFlag))
    {
        return false;
    }

    if (Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::AllPhase))
    {
        return true;
    }

    if (!isRecycler)
    {
        return (Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::RunPhase)
            || Js::Configuration::Global.flags.TraceMemory.GetFirstPhase() == Js::InvalidPhase);
    }

    return Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::RecyclerPhase);
}